

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::byte_const&>::operator>
          (expression_lhs<const_nonstd::byte_&> *this,byte *rhs)

{
  undefined1 *in_RDX;
  bool *in_RSI;
  result *in_RDI;
  byte *in_stack_00000118;
  string *in_stack_00000120;
  byte *in_stack_00000128;
  result *this_00;
  result *this_01;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [37];
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  
  local_42 = **(undefined1 **)in_RSI;
  local_43 = *in_RDX;
  this_00 = in_RDI;
  local_41 = nonstd::operator>((byte)0x0,(byte)0x0);
  this_01 = *(result **)in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,">",&local_c9);
  std::__cxx11::string::string(local_a8,local_c8);
  to_string<nonstd::byte,nonstd::byte>(in_stack_00000128,in_stack_00000120,in_stack_00000118);
  std::__cxx11::string::string(local_68,local_88);
  result::result<bool>(this_01,in_RSI,(text *)this_00);
  result::result(this_00,in_RDI);
  result::~result((result *)0x13414f);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return this_00;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }